

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::TestBase::initShaderSource
          (TestBase *this,SHADER_STAGES in_stage,bool in_use_version_400,shaderSource *out_source)

{
  GLint GVar1;
  reference pvVar2;
  uint local_30;
  uint local_2c;
  GLuint i_1;
  GLuint i;
  bool use_lengths;
  shaderSource *psStack_20;
  GLuint n_parts;
  shaderSource *out_source_local;
  bool in_use_version_400_local;
  TestBase *pTStack_10;
  SHADER_STAGES in_stage_local;
  TestBase *this_local;
  
  i = 0;
  i_1._3_1_ = 0;
  psStack_20 = out_source;
  out_source_local._3_1_ = in_use_version_400;
  out_source_local._4_4_ = in_stage;
  pTStack_10 = this;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&i,(long)&i_1 + 3);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::resize(&psStack_20->m_parts,(ulong)i);
  psStack_20->m_use_lengths = (bool)(i_1._3_1_ & 1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,(ulong)out_source_local._4_4_,(ulong)(out_source_local._3_1_ & 1),psStack_20);
  if ((i_1._3_1_ & 1) == 1) {
    for (local_2c = 0; local_2c < i; local_2c = local_2c + 1) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
      ::operator[](&psStack_20->m_parts,(ulong)local_2c);
      GVar1 = std::__cxx11::string::length();
      pvVar2 = std::
               vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ::operator[](&psStack_20->m_parts,(ulong)local_2c);
      pvVar2->m_length = GVar1;
      pvVar2 = std::
               vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ::operator[](&psStack_20->m_parts,(ulong)local_2c);
      std::__cxx11::string::append((char *)pvVar2);
    }
  }
  else {
    for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
      pvVar2 = std::
               vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ::operator[](&psStack_20->m_parts,(ulong)local_30);
      pvVar2->m_length = 0;
    }
  }
  return;
}

Assistant:

void TestBase::initShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400, Utils::shaderSource& out_source)
{
	/* Shader source configuration */
	glw::GLuint n_parts		= 0;
	bool		use_lengths = false;

	getShaderSourceConfig(n_parts, use_lengths);

	out_source.m_parts.resize(n_parts);
	out_source.m_use_lengths = use_lengths;

	/* Request child class to prepare shader sources */
	prepareShaderSource(in_stage, in_use_version_400, out_source);

	/* Prepare source lengths */
	if (true == use_lengths)
	{
		for (GLuint i = 0; i < n_parts; ++i)
		{
			out_source.m_parts[i].m_length = static_cast<glw::GLint>(out_source.m_parts[i].m_code.length());

			out_source.m_parts[i].m_code.append("This should be ignored by compiler, as source length is provided");
		}
	}
	else
	{
		for (GLuint i = 0; i < n_parts; ++i)
		{
			out_source.m_parts[i].m_length = 0;
		}
	}
}